

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrieiterator.cpp
# Opt level: O2

UChar * __thiscall
icu_63::UCharsTrie::Iterator::branchNext
          (Iterator *this,UChar *pos,int32_t length,UErrorCode *errorCode)

{
  char16_t cVar1;
  short sVar2;
  char16_t srcChar;
  uint uVar3;
  int32_t iVar4;
  char16_t *pcVar5;
  ushort uVar6;
  
  while( true ) {
    pcVar5 = pos + 2;
    cVar1 = pos[1];
    if (length < 6) break;
    if (0xfbff < (ushort)cVar1) {
      if ((ushort)cVar1 == 0xffff) {
        pcVar5 = pos + 4;
      }
      else {
        pcVar5 = pos + 3;
      }
    }
    UVector32::addElement
              (this->stack_,(int32_t)((ulong)((long)pcVar5 - (long)this->uchars_) >> 1),errorCode);
    sVar2 = (this->str_).fUnion.fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      uVar3 = (this->str_).fUnion.fFields.fLength;
    }
    else {
      uVar3 = (int)sVar2 >> 5;
    }
    UVector32::addElement(this->stack_,(length - ((uint)length >> 1)) * 0x10000 | uVar3,errorCode);
    pos = jumpByDelta(pos + 1);
    length = (uint)length >> 1;
  }
  srcChar = *pos;
  uVar3 = (ushort)cVar1 & 0x7fff;
  iVar4 = readValue(pcVar5,uVar3);
  uVar6 = (ushort)uVar3;
  if (0x3fff < uVar6) {
    if (uVar6 == 0x7fff) {
      pcVar5 = pos + 4;
    }
    else {
      pcVar5 = pos + 3;
    }
  }
  UVector32::addElement
            (this->stack_,(int32_t)((ulong)((long)pcVar5 - (long)this->uchars_) >> 1),errorCode);
  sVar2 = (this->str_).fUnion.fStackFields.fLengthAndFlags;
  if (sVar2 < 0) {
    uVar3 = (this->str_).fUnion.fFields.fLength;
  }
  else {
    uVar3 = (int)sVar2 >> 5;
  }
  UVector32::addElement(this->stack_,uVar3 | length * 0x10000 - 0x10000U,errorCode);
  UnicodeString::append(&this->str_,srcChar);
  if (cVar1 < L'\0') {
    this->pos_ = (char16_t *)0x0;
    this->value_ = iVar4;
    pcVar5 = (UChar *)0x0;
  }
  else {
    pcVar5 = pcVar5 + iVar4;
  }
  return pcVar5;
}

Assistant:

const UChar *
UCharsTrie::Iterator::branchNext(const UChar *pos, int32_t length, UErrorCode &errorCode) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison unit
        // Push state for the greater-or-equal edge.
        stack_->addElement((int32_t)(skipDelta(pos)-uchars_), errorCode);
        stack_->addElement(((length-(length>>1))<<16)|str_.length(), errorCode);
        // Follow the less-than edge.
        length>>=1;
        pos=jumpByDelta(pos);
    }
    // List of key-value pairs where values are either final values or jump deltas.
    // Read the first (key, value) pair.
    UChar trieUnit=*pos++;
    int32_t node=*pos++;
    UBool isFinal=(UBool)(node>>15);
    int32_t value=readValue(pos, node&=0x7fff);
    pos=skipValue(pos, node);
    stack_->addElement((int32_t)(pos-uchars_), errorCode);
    stack_->addElement(((length-1)<<16)|str_.length(), errorCode);
    str_.append(trieUnit);
    if(isFinal) {
        pos_=NULL;
        value_=value;
        return NULL;
    } else {
        return pos+value;
    }
}